

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O1

spv_result_t
spvtools::val::ValidateExecutionScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ushort uVar3;
  Function *pFVar4;
  _Head_base<1UL,_bool,_false> _Var5;
  bool bVar6;
  spv_result_t sVar7;
  DiagnosticStream *pDVar8;
  _Node *p_Var9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  Op opcode;
  string errorVUID;
  string local_280;
  Function *local_260;
  ulong local_258;
  char *local_250;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  undefined1 local_208 [8];
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  
  uVar3 = (inst->inst_).opcode;
  opcode = (Op)uVar3;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,scope);
  uVar12 = local_208._0_4_;
  _Var5._M_head_impl = local_208[4];
  uVar13 = (ulong)(uint)local_208._0_4_;
  sVar7 = ValidateScope(_,inst,scope);
  if (sVar7 != SPV_SUCCESS) {
    return sVar7;
  }
  if (_Var5._M_head_impl == false) {
    return SPV_SUCCESS;
  }
  bVar6 = spvIsVulkanEnv(_->context_->target_env);
  if (bVar6) {
    if (_->context_->target_env == SPV_ENV_VULKAN_1_0) {
LAB_001f2481:
      local_258 = uVar13;
      if (uVar12 != 3 && opcode == OpControlBarrier) {
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_208,_,0x124a,(char *)0x0);
        local_260 = ValidationState_t::function(_,inst->function_->id_);
        paVar2 = &local_280.field_2;
        local_280._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_280,CONCAT44(local_208._4_4_,local_208._0_4_),
                   local_200 + CONCAT44(local_208._4_4_,local_208._0_4_));
        local_218 = (code *)0x0;
        pcStack_210 = (code *)0x0;
        local_228._M_unused._M_object = (void *)0x0;
        local_228._8_8_ = 0;
        local_228._M_unused._M_object = operator_new(0x20);
        pFVar4 = local_260;
        *(code **)local_228._M_unused._0_8_ = (code *)((long)local_228._M_unused._0_8_ + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p == paVar2) {
          *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
               CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                        local_280.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = local_280.field_2._8_8_;
        }
        else {
          *(pointer *)local_228._M_unused._0_8_ = local_280._M_dataplus._M_p;
          *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
               CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                        local_280.field_2._M_local_buf[0]);
        }
        *(size_type *)((long)local_228._M_unused._0_8_ + 8) = local_280._M_string_length;
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        pcStack_210 = std::
                      _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_scopes.cpp:116:46)>
                      ::_M_invoke;
        local_218 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_scopes.cpp:116:46)>
                    ::_M_manager;
        local_280._M_dataplus._M_p = (pointer)paVar2;
        p_Var9 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&local_260->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_228);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar1 = &(pFVar4->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_218 != (code *)0x0) {
          (*local_218)(&local_228,&local_228,__destroy_functor);
        }
        uVar12 = (uint)local_258;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_208._4_4_,local_208._0_4_) != local_1f8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_208._4_4_,local_208._0_4_),
                          local_1f8[0]._M_allocated_capacity + 1);
        }
      }
      if (uVar12 == 2) {
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_208,_,0x121d,(char *)0x0);
        local_260 = ValidationState_t::function(_,inst->function_->id_);
        paVar2 = &local_280.field_2;
        local_280._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_280,CONCAT44(local_208._4_4_,local_208._0_4_),
                   local_200 + CONCAT44(local_208._4_4_,local_208._0_4_));
        local_238 = (code *)0x0;
        pcStack_230 = (code *)0x0;
        local_248._M_unused._M_object = (void *)0x0;
        local_248._8_8_ = 0;
        local_248._M_unused._M_object = operator_new(0x20);
        pFVar4 = local_260;
        *(code **)local_248._M_unused._0_8_ = (code *)((long)local_248._M_unused._0_8_ + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p == paVar2) {
          *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
               CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                        local_280.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x18) = local_280.field_2._8_8_;
        }
        else {
          *(pointer *)local_248._M_unused._0_8_ = local_280._M_dataplus._M_p;
          *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
               CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                        local_280.field_2._M_local_buf[0]);
        }
        *(size_type *)((long)local_248._M_unused._0_8_ + 8) = local_280._M_string_length;
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        pcStack_230 = std::
                      _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_scopes.cpp:147:15)>
                      ::_M_invoke;
        local_238 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_scopes.cpp:147:15)>
                    ::_M_manager;
        local_280._M_dataplus._M_p = (pointer)paVar2;
        p_Var9 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&local_260->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_248);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar1 = &(pFVar4->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_238 != (code *)0x0) {
          (*local_238)(&local_248,&local_248,__destroy_functor);
        }
        uVar12 = (uint)local_258;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_208._4_4_,local_208._0_4_) != local_1f8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_208._4_4_,local_208._0_4_),
                          local_1f8[0]._M_allocated_capacity + 1);
        }
      }
      if (0xfffffffd < uVar12 - 4) goto LAB_001f2802;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_280,_,0x121c,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_280._M_dataplus._M_p,local_280._M_string_length);
      local_250 = spvOpcodeString(opcode);
      pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_250);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar8,": in Vulkan environment Execution Scope is limited to ",0x36);
      pcVar11 = "Workgroup and Subgroup";
      lVar10 = 0x16;
    }
    else {
      bVar6 = spvOpcodeIsNonUniformGroupOperation((uint)uVar3);
      if ((uVar12 == 3 || !bVar6) || 0xfffffffd < uVar3 - 0x13f8) goto LAB_001f2481;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_280,_,0x1222,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_280._M_dataplus._M_p,local_280._M_string_length);
      local_250 = spvOpcodeString((uint)uVar3);
      pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_250);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar8,": in Vulkan environment Execution scope is limited to ",0x36);
      pcVar11 = "Subgroup";
      lVar10 = 8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8,pcVar11,lVar10);
    sVar7 = pDVar8->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
LAB_001f2802:
    bVar6 = spvOpcodeIsNonUniformGroupOperation(opcode);
    if (0xfffffffd < uVar12 - 4 || (0xfffffffd < opcode + ~OpGroupNonUniformQuadAnyKHR || !bVar6)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    local_280._M_dataplus._M_p = spvOpcodeString(opcode);
    pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar8,": Execution scope is limited to Subgroup or Workgroup",0x35);
    sVar7 = pDVar8->error_;
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return sVar7;
}

Assistant:

spv_result_t ValidateExecutionScope(ValidationState_t& _,
                                    const Instruction* inst, uint32_t scope) {
  spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t tmp_value = 0;
  std::tie(is_int32, is_const_int32, tmp_value) = _.EvalInt32IfConst(scope);

  if (auto error = ValidateScope(_, inst, scope)) {
    return error;
  }

  if (!is_const_int32) {
    return SPV_SUCCESS;
  }

  spv::Scope value = spv::Scope(tmp_value);

  // Vulkan specific rules
  if (spvIsVulkanEnv(_.context()->target_env)) {
    // Vulkan 1.1 specific rules
    if (_.context()->target_env != SPV_ENV_VULKAN_1_0) {
      // Scope for Non Uniform Group Operations must be limited to Subgroup
      if ((spvOpcodeIsNonUniformGroupOperation(opcode) &&
           (opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
           (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) &&
          (value != spv::Scope::Subgroup)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4642) << spvOpcodeString(opcode)
               << ": in Vulkan environment Execution scope is limited to "
               << "Subgroup";
      }
    }

    // OpControlBarrier must only use Subgroup execution scope for a subset of
    // execution models.
    if (opcode == spv::Op::OpControlBarrier && value != spv::Scope::Subgroup) {
      std::string errorVUID = _.VkErrorID(4682);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::Fragment ||
                model == spv::ExecutionModel::Vertex ||
                model == spv::ExecutionModel::Geometry ||
                model == spv::ExecutionModel::TessellationEvaluation ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, OpControlBarrier execution scope "
                    "must be Subgroup for Fragment, Vertex, Geometry, "
                    "TessellationEvaluation, RayGeneration, Intersection, "
                    "AnyHit, ClosestHit, and Miss execution models";
              }
              return false;
            }
            return true;
          });
    }

    // Only subset of execution models support Workgroup.
    if (value == spv::Scope::Workgroup) {
      std::string errorVUID = _.VkErrorID(4637);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskNV &&
                    model != spv::ExecutionModel::MeshNV &&
                    model != spv::ExecutionModel::TaskEXT &&
                    model != spv::ExecutionModel::MeshEXT &&
                    model != spv::ExecutionModel::TessellationControl &&
                    model != spv::ExecutionModel::GLCompute) {
                  if (message) {
                    *message =
                        errorVUID +
                        "in Vulkan environment, Workgroup execution scope is "
                        "only for TaskNV, MeshNV, TaskEXT, MeshEXT, "
                        "TessellationControl, and GLCompute execution models";
                  }
                  return false;
                }
                return true;
              });
    }

    // Vulkan generic rules
    // Scope for execution must be limited to Workgroup or Subgroup
    if (value != spv::Scope::Workgroup && value != spv::Scope::Subgroup) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4636) << spvOpcodeString(opcode)
             << ": in Vulkan environment Execution Scope is limited to "
             << "Workgroup and Subgroup";
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  // General SPIRV rules
  // Scope for execution must be limited to Workgroup or Subgroup for
  // non-uniform operations
  if (spvOpcodeIsNonUniformGroupOperation(opcode) &&
      opcode != spv::Op::OpGroupNonUniformQuadAllKHR &&
      opcode != spv::Op::OpGroupNonUniformQuadAnyKHR &&
      value != spv::Scope::Subgroup && value != spv::Scope::Workgroup) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Execution scope is limited to Subgroup or Workgroup";
  }

  return SPV_SUCCESS;
}